

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_suffix(char *s,char *t)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t m;
  size_t n;
  char *t_local;
  char *s_local;
  
  sVar2 = strlen(s);
  sVar3 = strlen(t);
  if (sVar2 < sVar3) {
    s_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(s + (sVar2 - sVar3),t);
    s_local._4_4_ = (uint)(iVar1 == 0);
  }
  return s_local._4_4_;
}

Assistant:

int stb_suffix(char *s, char *t)
{
   size_t n = strlen(s);
   size_t m = strlen(t);
   if (m <= n)
      return 0 == strcmp(s+n-m, t);
   else
      return 0;
}